

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall cmState::Reset(Snapshot *__return_storage_ptr__,cmState *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *pmVar2;
  iterator iVar3;
  key_type local_4c;
  string local_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&this->GlobalProperties);
  std::
  _Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear((_Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           *)this);
  cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate(&this->BuildsystemDirectory);
  iVar3 = cmLinkedTree<cmState::SnapshotDataType>::Truncate(&this->SnapshotData);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RULE_LAUNCH_COMPILE","");
  local_4c = DIRECTORY;
  pmVar2 = std::
           map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           ::operator[](&this->PropertyDefinitions,&local_4c);
  cmPropertyDefinitionMap::DefineProperty(pmVar2,&local_48,local_4c,"","",true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RULE_LAUNCH_LINK","");
  local_4c = DIRECTORY;
  pmVar2 = std::
           map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           ::operator[](&this->PropertyDefinitions,&local_4c);
  cmPropertyDefinitionMap::DefineProperty(pmVar2,&local_48,local_4c,"","",true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RULE_LAUNCH_CUSTOM","");
  local_4c = DIRECTORY;
  pmVar2 = std::
           map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           ::operator[](&this->PropertyDefinitions,&local_4c);
  cmPropertyDefinitionMap::DefineProperty(pmVar2,&local_48,local_4c,"","",true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RULE_LAUNCH_COMPILE","");
  local_4c = TARGET;
  pmVar2 = std::
           map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           ::operator[](&this->PropertyDefinitions,&local_4c);
  cmPropertyDefinitionMap::DefineProperty(pmVar2,&local_48,local_4c,"","",true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RULE_LAUNCH_LINK","");
  local_4c = TARGET;
  pmVar2 = std::
           map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           ::operator[](&this->PropertyDefinitions,&local_4c);
  cmPropertyDefinitionMap::DefineProperty(pmVar2,&local_48,local_4c,"","",true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RULE_LAUNCH_CUSTOM","");
  local_4c = TARGET;
  pmVar2 = std::
           map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           ::operator[](&this->PropertyDefinitions,&local_4c);
  cmPropertyDefinitionMap::DefineProperty(pmVar2,&local_48,local_4c,"","",true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->State = this;
  (__return_storage_ptr__->Position).Tree = iVar3.Tree;
  (__return_storage_ptr__->Position).Position = iVar3.Position;
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();

  this->BuildsystemDirectory.Truncate();
  PositionType pos = this->SnapshotData.Truncate();

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY,
     "", "", true);

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::TARGET,
     "", "", true);

  return Snapshot(this, pos);
}